

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aud_io.h
# Opt level: O0

int audioOpen(int samplerate,int channels,void *userdata,audio_callback_f acb,char *midi,
             midi_callback_f mcb)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  int err;
  midi_callback_f mcb_local;
  char *midi_local;
  audio_callback_f acb_local;
  void *userdata_local;
  int channels_local;
  int samplerate_local;
  
  iVar1 = snd_pcm_open(&audio_,"default",0);
  if (iVar1 < 0) {
    uVar3 = snd_strerror(iVar1);
    printf("Playback open error: %s\n",uVar3);
    channels_local = -1;
  }
  else {
    iVar1 = snd_pcm_set_params(audio_.pcm,0xe,3,channels,samplerate,1,10000);
    if (iVar1 < 0) {
      uVar3 = snd_strerror(iVar1);
      printf("set_params error: %s\n",uVar3);
      channels_local = -2;
    }
    else {
      if (((mcb == (midi_callback_f)0x0) || (midi == (char *)0x0)) || (*midi == '\0')) {
        audio_.midi = (snd_rawmidi_t *)0x0;
      }
      else {
        iVar1 = snd_rawmidi_open(0x2bfa40,0,midi,2);
        if (iVar1 < 0) {
          uVar3 = snd_strerror(iVar1);
          printf("rawmidi_open: %s\n",uVar3);
          return -3;
        }
      }
      audio_.should_exit = 0;
      audio_.acb = acb;
      audio_.mcb = mcb;
      audio_.channels = channels;
      uVar2 = pthread_create(&audio_.thread,(pthread_attr_t *)0x0,audio_Thread,userdata);
      if (uVar2 == 0) {
        channels_local = 1;
      }
      else {
        printf("pthread_create: %d\n",(ulong)uVar2);
        channels_local = -4;
      }
    }
  }
  return channels_local;
}

Assistant:

int audioOpen(int samplerate, int channels, void *userdata, audio_callback_f acb, const char *midi, midi_callback_f mcb) {
	int err = snd_pcm_open(&audio_.pcm, "default", SND_PCM_STREAM_PLAYBACK, 0);
	if (err < 0) {
		printf("Playback open error: %s\n", snd_strerror(err));
		return -1;
	}

	err = snd_pcm_set_params(audio_.pcm,
			SND_PCM_FORMAT_FLOAT_LE,
			SND_PCM_ACCESS_RW_INTERLEAVED,
			channels, samplerate, 1, 10000);
	if (err < 0) {
		printf("set_params error: %s\n", snd_strerror(err));
		return -2;
	}

	if (mcb && midi && midi[0] != '\0') {
		err = snd_rawmidi_open(&audio_.midi, NULL, midi, SND_RAWMIDI_NONBLOCK);
		if (err < 0) {
			printf("rawmidi_open: %s\n", snd_strerror(err));
			return -3;
		}
	} else {
		audio_.midi = NULL;
	}

	audio_.channels = channels;
	audio_.should_exit = 0;
	audio_.acb = acb;
	audio_.mcb = mcb;
	err = pthread_create(&audio_.thread, NULL, audio_Thread, userdata);
	if (err) {
		printf("pthread_create: %d\n", err);
		return -4;
	}

	return 1;
}